

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::lexer(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
        *this,input_stream_adapter *adapter)

{
  streambuf *psVar1;
  char cVar2;
  lconv *plVar3;
  
  psVar1 = adapter->sb;
  (this->ia).is = adapter->is;
  (this->ia).sb = psVar1;
  adapter->is = (istream *)0x0;
  adapter->sb = (streambuf *)0x0;
  this->current = -1;
  this->next_unget = false;
  (this->position).chars_read_total = 0;
  (this->position).chars_read_current_line = 0;
  (this->position).lines_read = 0;
  (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->token_buffer)._M_dataplus._M_p = (pointer)&(this->token_buffer).field_2;
  (this->token_buffer)._M_string_length = 0;
  (this->token_buffer).field_2._M_local_buf[0] = '\0';
  this->error_message = "";
  this->value_integer = 0;
  this->value_unsigned = 0;
  this->value_float = 0.0;
  plVar3 = localeconv();
  if (plVar3->decimal_point == (char *)0x0) {
    cVar2 = '.';
  }
  else {
    cVar2 = *plVar3->decimal_point;
  }
  this->decimal_point_char = cVar2;
  return;
}

Assistant:

explicit lexer(InputAdapterType&& adapter)
        : ia(std::move(adapter)), decimal_point_char(get_decimal_point()) {}